

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O2

string * __thiscall
TokenScanner::scanString_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  string *psVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  string token;
  allocator local_7d;
  int local_7c;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_70,"",&local_7d);
  cVar2 = std::istream::get();
  local_7c = (int)cVar2;
  std::__cxx11::string::push_back((char)&local_70);
  bVar4 = 0;
  while( true ) {
    iVar3 = std::istream::get();
    if (iVar3 == -1) {
      std::__cxx11::string::string
                ((string *)&local_50,"TokenScanner found unterminated string",&local_7d);
      error(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    psVar1 = local_78;
    if (!(bool)(iVar3 != cVar2 | bVar4)) break;
    std::__cxx11::string::push_back((char)&local_70);
    bVar4 = (bVar4 ^ 1) & iVar3 == 0x5c;
  }
  std::operator+(local_78,&local_70,(char)local_7c);
  std::__cxx11::string::~string((string *)&local_70);
  return psVar1;
}

Assistant:

string TokenScanner::scanString() {
   string token = "";
   char delim = isp->get();
   token += delim;
   bool escape = false;
   while (true) {
      int ch = isp->get();
      if (ch == EOF) error("TokenScanner found unterminated string");
      if (ch == delim && !escape) break;
      escape = (ch == '\\') && !escape;
      token += ch;
   }
   return token + delim;
}